

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zlib_buffer_compressor_test.cpp
# Opt level: O3

void __thiscall
bidfx_public_api::tools::ZLIBBufferCompressorTest_test_compression_of_big_buffer_in_chunks_Test::
TestBody(ZLIBBufferCompressorTest_test_compression_of_big_buffer_in_chunks_Test *this)

{
  ulong uVar1;
  ulong uVar2;
  int iVar3;
  vector<unsigned_char,_std::allocator<unsigned_char>_> input_buffer;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_58;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_38;
  
  local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve
            (&local_58,(this->super_ZLIBBufferCompressorTest).BIGGER_TEXT._M_string_length << 10);
  uVar1 = (this->super_ZLIBBufferCompressorTest).BIGGER_TEXT._M_string_length;
  iVar3 = 0;
  do {
    if (uVar1 == 0) {
      uVar1 = 0;
    }
    else {
      uVar2 = 0;
      do {
        std::vector<unsigned_char,std::allocator<unsigned_char>>::emplace_back<char&>
                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_58,
                   (this->super_ZLIBBufferCompressorTest).BIGGER_TEXT._M_dataplus._M_p + uVar2);
        uVar2 = uVar2 + 1;
        uVar1 = (this->super_ZLIBBufferCompressorTest).BIGGER_TEXT._M_string_length;
      } while (uVar2 < uVar1);
    }
    iVar3 = iVar3 + 1;
  } while (iVar3 != 0x400);
  ZLIBBufferCompressorTest::TestCompression
            (&local_38,&this->super_ZLIBBufferCompressorTest,&local_58,0x10000);
  if (local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

TEST_F(ZLIBBufferCompressorTest, test_compression_of_big_buffer_in_chunks)
{
    std::vector<unsigned char> input_buffer;
    input_buffer.reserve(BIGGER_TEXT.size() * 1024);
    for (int i = 0; i < 1024; i++)
    {
        for (int j = 0; j < BIGGER_TEXT.size(); j++)
        {
            input_buffer.emplace_back(BIGGER_TEXT[j]);
        }
    }

    TestCompression(input_buffer, 65536);
}